

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool lsvm::string::equals(string *s1,string *s2)

{
  char cVar1;
  char cVar2;
  long lVar3;
  
  if ((s1->size == s2->size) && (s1->count == s2->count)) {
    lVar3 = 8;
    while( true ) {
      cVar1 = *(char *)((long)&s1->count + lVar3);
      cVar2 = *(char *)((long)&s2->count + lVar3);
      if (cVar1 == '\0') {
        return cVar2 == '\0';
      }
      if (cVar1 != cVar2) break;
      lVar3 = lVar3 + 1;
    }
  }
  return false;
}

Assistant:

bool equals(string* s1, string* s2){
    if(s1->size != s2->size || s1->count != s2->count)
        return false;

    char* s1p = c_str(s1);
    char* s2p = c_str(s2);

    while(*s1p != '\0'){
        if(*s1p != *s2p)
            return false;
        ++s1p; ++s2p;
    }

    return *s2p == '\0' && *s1p == *s2p;
}